

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

int32 insert(heapelement_t ***heap,int32 heapsize,heapelement_t *newelement)

{
  int32 iVar1;
  heapelement_t *phVar2;
  bool bVar3;
  int32 iVar4;
  heapelement_t **pphVar5;
  int32 y;
  int32 x;
  heapelement_t *tmp;
  int32 newheapsize;
  int32 id;
  heapelement_t **lheap;
  heapelement_t *newelement_local;
  int32 heapsize_local;
  heapelement_t ***heap_local;
  
  if (heapsize == 0) {
    *heap = (heapelement_t **)0x0;
  }
  pphVar5 = (heapelement_t **)realloc(*heap,(long)(heapsize + 1) << 3);
  pphVar5[heapsize] = newelement;
  newelement->heapid = heapsize;
  tmp._4_4_ = heapsize;
  while( true ) {
    bVar3 = false;
    if (0 < tmp._4_4_) {
      iVar4 = compare(pphVar5[tmp._4_4_],pphVar5[(tmp._4_4_ + -1) / 2]);
      bVar3 = 0 < iVar4;
    }
    if (!bVar3) break;
    iVar4 = pphVar5[tmp._4_4_]->heapid;
    iVar1 = pphVar5[(tmp._4_4_ + -1) / 2]->heapid;
    phVar2 = pphVar5[tmp._4_4_];
    pphVar5[tmp._4_4_] = pphVar5[(tmp._4_4_ + -1) / 2];
    pphVar5[(tmp._4_4_ + -1) / 2] = phVar2;
    pphVar5[tmp._4_4_]->heapid = iVar4;
    pphVar5[(tmp._4_4_ + -1) / 2]->heapid = iVar1;
    tmp._4_4_ = (tmp._4_4_ + -1) / 2;
  }
  *heap = pphVar5;
  return heapsize + 1;
}

Assistant:

int32 insert(heapelement_t ***heap, int32 heapsize, heapelement_t *newelement)
{
    heapelement_t **lheap;
    int32 id, newheapsize = heapsize + 1;

    if (heapsize == 0) *heap = NULL; /* Needed for realloc to work */
    lheap = (heapelement_t**) realloc(*heap,newheapsize*sizeof(heapelement_t*));

    lheap[heapsize] = newelement;
    newelement->heapid = heapsize;

    id = heapsize;
    while (id > 0 && compare(lheap[id],lheap[PARENTID(id)]) > 0){
	SWAP(lheap[id],lheap[PARENTID(id)]);
	id = PARENTID(id);
    }

    *heap = lheap;
    return(newheapsize);
}